

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O3

void __thiscall TadsMessageQueue::~TadsMessageQueue(TadsMessageQueue *this)

{
  ~TadsMessageQueue(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~TadsMessageQueue()
    {
        /* discard any messages still in the queue */
        flush();

        /* destroy our synchronization resources */
        mu->release_ref();
        ev->release_ref();
        if (quit_evt != 0)
            quit_evt->release_ref();
    }